

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O2

uint32_t ScaleDown(uint16_t a,uint16_t b,uint16_t c,uint16_t d,int rgb_bit_depth,
                  SharpYuvTransferFunctionType transfer_type)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  
  iVar6 = 2;
  if (0xc < rgb_bit_depth) {
    iVar6 = 0xe - rgb_bit_depth;
  }
  iVar6 = iVar6 + rgb_bit_depth;
  uVar2 = SharpYuvGammaToLinear(a,iVar6,transfer_type);
  uVar3 = SharpYuvGammaToLinear(b,iVar6,transfer_type);
  uVar4 = SharpYuvGammaToLinear(c,iVar6,transfer_type);
  uVar5 = SharpYuvGammaToLinear(d,iVar6,transfer_type);
  uVar1 = SharpYuvLinearToGamma(uVar5 + uVar3 + uVar2 + uVar4 + 2 >> 2,iVar6,transfer_type);
  return (uint32_t)uVar1;
}

Assistant:

static uint32_t ScaleDown(uint16_t a, uint16_t b, uint16_t c, uint16_t d,
                          int rgb_bit_depth,
                          SharpYuvTransferFunctionType transfer_type) {
  const int bit_depth = rgb_bit_depth + GetPrecisionShift(rgb_bit_depth);
  const uint32_t A = SharpYuvGammaToLinear(a, bit_depth, transfer_type);
  const uint32_t B = SharpYuvGammaToLinear(b, bit_depth, transfer_type);
  const uint32_t C = SharpYuvGammaToLinear(c, bit_depth, transfer_type);
  const uint32_t D = SharpYuvGammaToLinear(d, bit_depth, transfer_type);
  return SharpYuvLinearToGamma((A + B + C + D + 2) >> 2, bit_depth,
                               transfer_type);
}